

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::QuantizationParams::QuantizationParams
          (QuantizationParams *this,QuantizationParams *from)

{
  LookUpTableQuantizationParams *this_00;
  LinearQuantizationParams *this_01;
  undefined1 *puVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__QuantizationParams_003fda18;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->numberofbits_ = from->numberofbits_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    this_01 = _internal_mutable_linearquantization(this);
    if (from->_oneof_case_[0] == 0x65) {
      puVar1 = (undefined1 *)(from->QuantizationType_).linearquantization_;
    }
    else {
      puVar1 = _LinearQuantizationParams_default_instance_;
    }
    LinearQuantizationParams::MergeFrom(this_01,(LinearQuantizationParams *)puVar1);
  }
  else if (from->_oneof_case_[0] == 0x66) {
    this_00 = _internal_mutable_lookuptablequantization(this);
    if (from->_oneof_case_[0] == 0x66) {
      puVar1 = (undefined1 *)(from->QuantizationType_).lookuptablequantization_;
    }
    else {
      puVar1 = _LookUpTableQuantizationParams_default_instance_;
    }
    LookUpTableQuantizationParams::MergeFrom(this_00,(LookUpTableQuantizationParams *)puVar1);
  }
  return;
}

Assistant:

QuantizationParams::QuantizationParams(const QuantizationParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  numberofbits_ = from.numberofbits_;
  clear_has_QuantizationType();
  switch (from.QuantizationType_case()) {
    case kLinearQuantization: {
      _internal_mutable_linearquantization()->::CoreML::Specification::LinearQuantizationParams::MergeFrom(from._internal_linearquantization());
      break;
    }
    case kLookupTableQuantization: {
      _internal_mutable_lookuptablequantization()->::CoreML::Specification::LookUpTableQuantizationParams::MergeFrom(from._internal_lookuptablequantization());
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.QuantizationParams)
}